

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Skip
          (CopyingFileInputStream *this,int count)

{
  LogMessage *pLVar1;
  __off_t _Var2;
  LogMessage local_30;
  Voidify local_1d;
  int local_1c;
  CopyingFileInputStream *pCStack_18;
  int count_local;
  CopyingFileInputStream *this_local;
  
  local_1c = count;
  pCStack_18 = this;
  if ((this->is_closed_ & 1U) == 0) {
    if (((this->previous_seek_failed_ & 1U) == 0) &&
       (_Var2 = lseek(this->file_,(long)count,1), _Var2 != -1)) {
      this_local._4_4_ = local_1c;
    }
    else {
      this->previous_seek_failed_ = true;
      this_local._4_4_ = CopyingInputStream::Skip(&this->super_CopyingInputStream,local_1c);
    }
    return this_local._4_4_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
             ,0x84,"!is_closed_");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

int FileInputStream::CopyingFileInputStream::Skip(int count) {
  ABSL_CHECK(!is_closed_);

  if (!previous_seek_failed_ && lseek(file_, count, SEEK_CUR) != (off_t)-1) {
    // Seek succeeded.
    return count;
  } else {
    // Failed to seek.

    // Note to self:  Don't seek again.  This file descriptor doesn't
    // support it.
    previous_seek_failed_ = true;

    // Use the default implementation.
    return CopyingInputStream::Skip(count);
  }
}